

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLReader.cpp
# Opt level: O1

bool __thiscall xercesc_4_0::XMLReader::skippedChar(XMLReader *this,XMLCh toSkip)

{
  bool bVar1;
  
  if (((this->fCharIndex != this->fCharsAvail) || (bVar1 = refreshCharBuffer(this), bVar1)) &&
     (this->fCharBuf[this->fCharIndex] == toSkip)) {
    this->fCharIndex = this->fCharIndex + 1;
    this->fCurCol = this->fCurCol + 1;
    return true;
  }
  return false;
}

Assistant:

bool XMLReader::skippedChar(const XMLCh toSkip)
{
    //
    //  If the buffer is empty, then try to reload it. If we still get
    //  nothing, then return false.
    //
    if (fCharIndex == fCharsAvail)
    {
        if (!refreshCharBuffer())
            return false;
    }

    //
    //  See if the current char is the one we want. If so, then we need
    //  to eat it and return true.
    //
    if (fCharBuf[fCharIndex] == toSkip)
    {
        fCharIndex++;
        fCurCol++;
        return true;
    }
    return false;
}